

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetObjectNumberS64(JlDataObject *NumberObject,int64_t *pNumberS64)

{
  JL_NUM_TYPE JVar1;
  JL_STATUS JVar2;
  anon_union_8_3_eb7f4dc6_for_JlNumber_1 aVar3;
  
  if (pNumberS64 == (int64_t *)0x0 || NumberObject == (JlDataObject *)0x0) {
    return JL_STATUS_INVALID_PARAMETER;
  }
  if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
    JVar1 = (NumberObject->field_2).Number.Type;
    if (JVar1 == JL_NUM_TYPE_UNSIGNED) {
      aVar3 = (anon_union_8_3_eb7f4dc6_for_JlNumber_1)(NumberObject->field_2).List.ListHead;
      JVar2 = JL_STATUS_SUCCESS;
      if (-1 < aVar3.s64) goto LAB_00101c71;
    }
    else if (JVar1 == JL_NUM_TYPE_SIGNED) {
      aVar3 = (NumberObject->field_2).Number.field_1;
      JVar2 = JL_STATUS_SUCCESS;
      goto LAB_00101c71;
    }
    JVar2 = JL_STATUS_VALUE_OUT_OF_RANGE;
  }
  else {
    JVar2 = JL_STATUS_WRONG_TYPE;
  }
  aVar3.u64 = 0;
LAB_00101c71:
  *pNumberS64 = (int64_t)aVar3;
  return JVar2;
}

Assistant:

JL_STATUS
    JlGetObjectNumberS64
    (
        JlDataObject const* NumberObject,
        int64_t*            pNumberS64
    )
{
    JL_STATUS jlStatus;

    if(     NULL != NumberObject
        &&  NULL != pNumberS64 )
    {
        if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_SIGNED == NumberObject->Number.Type )
        {
            // Number stored as a signed integer. Easy.
            *pNumberS64 = NumberObject->Number.s64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if(     JL_DATA_TYPE_NUMBER == NumberObject->Type
            &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type
            &&  NumberObject->Number.u64 <= INT64_MAX )
        {
            // Number is stored as unsigned number but it is smaller than INT64_MAX so it can be represented
            // in a signed 64 bit number
            *pNumberS64 = NumberObject->Number.u64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            // Wrong type of number
            *pNumberS64 = 0;
            jlStatus = JL_STATUS_VALUE_OUT_OF_RANGE;
        }
        else
        {
            *pNumberS64 = 0;
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}